

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswmcpl.c
# Opt level: O2

int mcpl2ssw_parse_args(int argc,char **argv,char **inmcplfile,char **refsswfile,char **outsswfile,
                       long *nparticles_limit,long *surface_id)

{
  long lVar1;
  int iVar2;
  size_t sVar3;
  char **ppcVar4;
  long *plVar5;
  char cVar6;
  ulong uVar7;
  char *pcVar8;
  long lVar9;
  bool bVar10;
  int64_t opt_num_limit;
  char **local_48;
  long local_40;
  long *local_38;
  
  *inmcplfile = (char *)0x0;
  *refsswfile = (char *)0x0;
  *outsswfile = (char *)0x0;
  *nparticles_limit = 0x7fffffff;
  *surface_id = 0;
  opt_num_limit = -1;
  local_40 = -1;
  local_48 = inmcplfile;
  local_38 = nparticles_limit;
  for (lVar9 = 1; lVar9 < argc; lVar9 = lVar9 + 1) {
    pcVar8 = argv[lVar9];
    sVar3 = strlen(pcVar8);
    if (sVar3 != 0) {
      if (sVar3 == 1) {
        cVar6 = *pcVar8;
      }
      else {
        cVar6 = *pcVar8;
        if ((cVar6 == '-') && (pcVar8[1] != '-')) {
          plVar5 = (long *)0x0;
          uVar7 = 1;
          while (uVar7 < sVar3) {
            cVar6 = pcVar8[uVar7];
            if (plVar5 == (long *)0x0) {
              plVar5 = &opt_num_limit;
              if (cVar6 != 'l') {
                if (cVar6 != 's') {
                  if (cVar6 == 'h') goto LAB_001048ac;
                  pcVar8 = "Unrecognised option";
                  goto LAB_0010487c;
                }
                plVar5 = &local_40;
              }
              *plVar5 = 0;
              bVar10 = sVar3 - 1 == uVar7;
              uVar7 = uVar7 + 1;
              if (bVar10) {
                pcVar8 = "Bad option: missing number";
                goto LAB_0010487c;
              }
            }
            else {
              if ((byte)(cVar6 - 0x3aU) < 0xf6) {
                pcVar8 = "Bad option: expected number";
                goto LAB_0010487c;
              }
              lVar1 = *plVar5;
              *plVar5 = lVar1 * 10;
              *plVar5 = lVar1 * 10 + (long)pcVar8[uVar7] + -0x30;
              uVar7 = uVar7 + 1;
            }
          }
          goto LAB_0010475e;
        }
        if ((sVar3 == 6) && (iVar2 = strcmp(pcVar8,"--help"), iVar2 == 0)) {
LAB_001048ac:
          mcpl2ssw_app_usage(argv,(char *)0x0);
          return -1;
        }
      }
      if (cVar6 == '-') {
        pcVar8 = "Bad arguments";
        goto LAB_0010487c;
      }
      if (*outsswfile != (char *)0x0) {
        pcVar8 = "Too many arguments.";
        goto LAB_0010487c;
      }
      ppcVar4 = outsswfile;
      if ((*refsswfile == (char *)0x0) && (ppcVar4 = refsswfile, *local_48 == (char *)0x0)) {
        ppcVar4 = local_48;
      }
      *ppcVar4 = pcVar8;
    }
LAB_0010475e:
  }
  if (*local_48 == (char *)0x0) {
    pcVar8 = "Missing argument : input MCPL file";
  }
  else if (*refsswfile == (char *)0x0) {
    pcVar8 = "Missing argument : Reference SSW file";
  }
  else {
    if (*outsswfile == (char *)0x0) {
      *outsswfile = "output.ssw";
    }
    if (opt_num_limit < 1) {
      opt_num_limit = 0x7fffffff;
    }
    else if ((ulong)opt_num_limit >> 0x1f != 0) {
      pcVar8 = "Parameter out of range : SSW files can only hold up to 2147483647 particles.";
      goto LAB_0010487c;
    }
    *local_38 = opt_num_limit;
    if (local_40 != 0 && local_40 < 1000000) {
      if (local_40 < 1) {
        local_40 = 0;
      }
      *surface_id = local_40;
      return 0;
    }
    pcVar8 = "Parameter out of range : Surface ID must be in range [1,999999].";
  }
LAB_0010487c:
  iVar2 = mcpl2ssw_app_usage(argv,pcVar8);
  return iVar2;
}

Assistant:

int mcpl2ssw_parse_args(int argc,const char **argv, const char** inmcplfile,
                        const char **refsswfile, const char **outsswfile,
                        long* nparticles_limit, long* surface_id) {
  //returns: 0 all ok, 1: error, -1: all ok but do nothing (-h/--help mode)
  *inmcplfile = 0;
  *refsswfile = 0;
  *outsswfile = 0;
  *nparticles_limit = INT32_MAX;
  *surface_id = 0;

  int64_t opt_num_limit = -1;
  int64_t opt_num_isurf = -1;
  int i;
  for (i = 1; i<argc; ++i) {
    const char * a = argv[i];
    size_t n = strlen(a);
    if (!n)
      continue;
    if (n>=2&&a[0]=='-'&&a[1]!='-') {
      //short options:
      int64_t * consume_digit = 0;
      size_t j;
      for (j=1; j<n; ++j) {
        if (consume_digit) {
          if (a[j]<'0'||a[j]>'9')
            return mcpl2ssw_app_usage(argv,"Bad option: expected number");
          *consume_digit *= 10;
          *consume_digit += a[j] - '0';
          continue;
        }
        switch(a[j]) {
        case 'h': mcpl2ssw_app_usage(argv,0); return -1;
        case 'l': consume_digit = &opt_num_limit; break;
        case 's': consume_digit = &opt_num_isurf; break;
        default:
          return mcpl2ssw_app_usage(argv,"Unrecognised option");
        }
        if (consume_digit) {
          *consume_digit = 0;
          if (j+1==n)
            return mcpl2ssw_app_usage(argv,"Bad option: missing number");
        }
      }

    } else if (n==6 && strcmp(a,"--help")==0) {
      mcpl2ssw_app_usage(argv,0);
      return -1;
    } else if (n>=1&&a[0]!='-') {
      if (*outsswfile)
        return mcpl2ssw_app_usage(argv,"Too many arguments.");
      if (*refsswfile) *outsswfile = a;
      else if (*inmcplfile) *refsswfile = a;
      else *inmcplfile = a;
    } else {
      return mcpl2ssw_app_usage(argv,"Bad arguments");
    }
  }

  if (!*inmcplfile)
    return mcpl2ssw_app_usage(argv,"Missing argument : input MCPL file");
  if (!*refsswfile)
    return mcpl2ssw_app_usage(argv,"Missing argument : Reference SSW file");
  if (!*outsswfile)
    *outsswfile = "output.ssw";

  if (opt_num_limit<=0)
    opt_num_limit = INT32_MAX;
  if (opt_num_limit>INT32_MAX)
    return mcpl2ssw_app_usage(argv,"Parameter out of range : SSW files can only hold up to 2147483647 particles.");
  *nparticles_limit = (long)opt_num_limit;

  if (opt_num_isurf==0||opt_num_isurf>999999)
    return mcpl2ssw_app_usage(argv,"Parameter out of range : Surface ID must be in range [1,999999].");
  if (opt_num_isurf<0)
    opt_num_isurf = 0;

  *surface_id = (long)opt_num_isurf;

  return 0;
}